

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

ssize_t read(int __fd,void *__buf,size_t __nbytes)

{
  HistorySuggestion *history;
  Printer *printer;
  bool bVar1;
  uchar uVar2;
  long lVar3;
  ssize_t sVar4;
  uchar *puVar5;
  optional<unsigned_char> local_32 [4];
  CharOpt c;
  
  bVar1 = anon_unknown.dwarf_5f77::is_terminal_input(__fd);
  if (bVar1) {
    __tls_init();
    lVar3 = __tls_get_addr(&PTR_00111ef0);
    bVar1 = yb::PrintBuffer::empty((PrintBuffer *)(lVar3 + 0x50));
    if (!bVar1) {
      __tls_init();
      yb::PrintBuffer::getNextChar((PrintBuffer *)(lVar3 + 0x50));
      if (local_32[0].super__Optional_base<unsigned_char,_false>._M_engaged == true) {
        puVar5 = std::experimental::fundamentals_v1::optional<unsigned_char>::value(local_32);
        *(uchar *)__buf = *puVar5;
        __tls_init();
        puVar5 = std::experimental::fundamentals_v1::optional<unsigned_char>::value(local_32);
        yb::LineBuffer::insert((LineBuffer *)(lVar3 + 0x28),*puVar5);
      }
      return 1;
    }
  }
  lVar3 = __tls_get_addr(&PTR_00111ef0);
  sVar4 = (**(code **)(lVar3 + 0x78))(__fd,__buf,__nbytes);
  bVar1 = anon_unknown.dwarf_5f77::is_terminal_input(__fd);
  if (bVar1) {
    __tls_init();
    history = *(HistorySuggestion **)(lVar3 + 8);
    __tls_init();
    printer = *(Printer **)(lVar3 + 0x18);
    __tls_init();
    __tls_init();
    __tls_init();
    uVar2 = yb::yebash(history,printer,(LineBuffer *)(lVar3 + 0x28),(PrintBuffer *)(lVar3 + 0x50),
                       *(ArrowHandler **)(lVar3 + 0x20),*__buf);
    *(uchar *)__buf = uVar2;
  }
  return sVar4;
}

Assistant:

ssize_t read(int fd, void *buf, size_t count) {
    if (is_terminal_input(fd) && !printBuffer.empty()) {
        putCharToReadBuffer(static_cast<char *>(buf));
        return 1;
    }
    auto returnValue = realRead(fd, buf, count);
    if (is_terminal_input(fd)) {
        *static_cast<unsigned char *>(buf) = yb::yebash(*historySuggestion, *printer, lineBuffer, printBuffer, *arrowHandler, *static_cast<unsigned char *>(buf));
    }
    return returnValue;
}